

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O3

__pid_t __thiscall kj::Promise<siginfo_t>::wait(Promise<siginfo_t> *this,void *__stat_loc)

{
  SourceLocation location;
  long lVar1;
  WaitScope *in_RDX;
  PromiseBase *pPVar2;
  Promise<siginfo_t> *pPVar3;
  byte bVar4;
  undefined8 in_stack_00000008;
  undefined8 in_stack_00000010;
  undefined8 in_stack_00000018;
  ExceptionOr<siginfo_t> result;
  ExceptionOrValue local_228;
  char local_90;
  PromiseBase local_88 [16];
  
  bVar4 = 0;
  local_228.exception.ptr.isSet = false;
  local_90 = '\0';
  location.function = (char *)in_stack_00000010;
  location.fileName = (char *)in_stack_00000008;
  location._16_8_ = in_stack_00000018;
  kj::_::waitImpl((OwnPromiseNode *)__stat_loc,&local_228,in_RDX,location);
  if (local_90 == '\x01') {
    if (local_228.exception.ptr.isSet != false) {
      throwRecoverableException(&local_228.exception.ptr.field_1.value,0);
    }
    pPVar2 = local_88;
    pPVar3 = this;
    for (lVar1 = 0x10; lVar1 != 0; lVar1 = lVar1 + -1) {
      (pPVar3->super_PromiseBase).node.ptr = (pPVar2->node).ptr;
      pPVar2 = pPVar2 + (ulong)bVar4 * -2 + 1;
      pPVar3 = pPVar3 + (ulong)bVar4 * -2 + 1;
    }
    if ((local_228.exception.ptr.isSet & 1U) != 0) {
      Exception::~Exception(&local_228.exception.ptr.field_1.value);
    }
    return (__pid_t)this;
  }
  if (local_228.exception.ptr.isSet != false) {
    throwFatalException(&local_228.exception.ptr.field_1.value,0);
  }
  kj::_::unreachable();
}

Assistant:

T Promise<T>::wait(WaitScope& waitScope, SourceLocation location) {
  _::ExceptionOr<_::FixVoid<T>> result;
  _::waitImpl(kj::mv(node), result, waitScope, location);
  return convertToReturn(kj::mv(result));
}